

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckBlink(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  ctmbstr ptVar2;
  ctmbstr cp;
  
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
    BVar1 = prvTidynodeIsText(node->content);
    if (BVar1 != no) {
      ptVar2 = textFromOneNode(doc,node->content);
      while (*ptVar2 != '\0') {
        BVar1 = prvTidyIsWhite((int)*ptVar2);
        ptVar2 = ptVar2 + 1;
        if (BVar1 == no) {
          prvTidyReportAccessError(doc,node,0x2e5);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void CheckBlink( TidyDocImpl* doc, Node* node )
{
    
    if (Level2_Enabled( doc ))
    {
        /* Checks to see if text is found within the BLINK element. */
        if ( TY_(nodeIsText)(node->content) )
        {
            ctmbstr word = textFromOneNode( doc, node->content );
            if ( !IsWhitespace(word) )
            {
                TY_(ReportAccessError)( doc, node, REMOVE_BLINK_MARQUEE );
            }
        }
    }
}